

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::SimpleTransformPromiseNode<void,_Func_&>::destroy
          (SimpleTransformPromiseNode<void,_Func_&> *this)

{
  SimpleTransformPromiseNode<void,_Func_&> *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::TestCase1884::run()::Func&>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }